

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

string * Catch::(anonymous_namespace)::getCurrentTimestamp_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_81;
  char *local_80;
  char *fmt;
  char timeStamp [21];
  unsigned_long timeStampSize;
  tm timeInfo;
  time_t local_18;
  time_t rawtime;
  
  time(&local_18);
  timeInfo.tm_wday = 0;
  timeInfo.tm_yday = 0;
  timeInfo.tm_isdst = 0;
  timeInfo._36_4_ = 0;
  timeInfo.tm_hour = 0;
  timeInfo.tm_mday = 0;
  timeInfo.tm_mon = 0;
  timeInfo.tm_year = 0;
  timeStampSize = 0;
  timeInfo.tm_sec = 0;
  timeInfo.tm_min = 0;
  timeInfo.tm_gmtoff = 0;
  gmtime_r(&local_18,(tm *)&timeStampSize);
  stack0xffffffffffffffa0 = 0x15;
  local_80 = "%Y-%m-%dT%H:%M:%SZ";
  strftime((char *)&fmt,0x15,"%Y-%m-%dT%H:%M:%SZ",(tm *)&timeStampSize);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,(char *)&fmt,0x14,&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return in_RDI;
}

Assistant:

std::string getCurrentTimestamp() {
            time_t rawtime;
            std::time(&rawtime);

            std::tm timeInfo = {};
#if defined (_MSC_VER) || defined (__MINGW32__)
            gmtime_s(&timeInfo, &rawtime);
#elif defined (CATCH_PLATFORM_PLAYSTATION)
            gmtime_s(&rawtime, &timeInfo);
#elif defined (__IAR_SYSTEMS_ICC__)
            timeInfo = *std::gmtime(&rawtime);
#else
            gmtime_r(&rawtime, &timeInfo);
#endif

            auto const timeStampSize = sizeof("2017-01-16T17:06:45Z");
            char timeStamp[timeStampSize];
            const char * const fmt = "%Y-%m-%dT%H:%M:%SZ";

            std::strftime(timeStamp, timeStampSize, fmt, &timeInfo);

            return std::string(timeStamp, timeStampSize - 1);
        }